

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_sse41_128_64.c
# Opt level: O3

parasail_result_t *
parasail_sw_stats_rowcol_striped_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long *plVar1;
  undefined4 *puVar2;
  undefined4 *puVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined1 auVar14 [16];
  __m128i *palVar15;
  bool bVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  parasail_result_t *result;
  __m128i *b;
  __m128i *palVar22;
  __m128i *b_00;
  __m128i *palVar23;
  __m128i *b_01;
  __m128i *palVar24;
  __m128i *b_02;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *b_06;
  __m128i *palVar25;
  long lVar26;
  longlong lVar27;
  long lVar28;
  ulong uVar29;
  uint uVar30;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  long lVar31;
  void *pvVar32;
  __m128i *palVar33;
  __m128i *palVar34;
  __m128i *palVar35;
  ulong uVar36;
  __m128i *ptr;
  uint uVar37;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *palVar38;
  ulong size;
  __m128i *palVar39;
  __m128i *ptr_02;
  bool bVar40;
  ulong uVar41;
  ulong uVar42;
  undefined4 uVar55;
  undefined1 auVar43 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  ulong uVar56;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ulong uVar57;
  long lVar58;
  undefined4 uVar63;
  __m128i_64_t B_2;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  long lVar64;
  undefined1 auVar62 [16];
  undefined4 uVar69;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined4 uVar72;
  __m128i_64_t B_9;
  undefined1 auVar71 [16];
  __m128i_64_t B_1;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  long lVar76;
  __m128i_64_t B_10;
  undefined1 auVar77 [16];
  __m128i_64_t B_11;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  __m128i_64_t A;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  longlong lVar91;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  longlong lVar93;
  undefined1 auVar92 [16];
  __m128i_64_t B;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  __m128i_64_t B_12;
  longlong lVar100;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i c_06;
  int32_t column_len;
  ulong local_1c8;
  __m128i *local_1b0;
  __m128i *local_1a8;
  __m128i *local_1a0;
  __m128i *local_198;
  __m128i *local_178;
  __m128i *local_168;
  undefined8 uStack_160;
  __m128i *local_138;
  undefined1 local_128 [16];
  int local_118;
  ulong uStack_e0;
  longlong local_d8;
  long local_c8;
  ulong uStack_a0;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_stats_rowcol_striped_profile_sse41_128_64_cold_8();
  }
  else {
    pvVar4 = (profile->profile64).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sw_stats_rowcol_striped_profile_sse41_128_64_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sw_stats_rowcol_striped_profile_sse41_128_64_cold_6();
      }
      else {
        uVar37 = profile->s1Len;
        uVar21 = (ulong)uVar37;
        if ((int)uVar37 < 1) {
          parasail_sw_stats_rowcol_striped_profile_sse41_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_stats_rowcol_striped_profile_sse41_128_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_stats_rowcol_striped_profile_sse41_128_64_cold_3();
        }
        else if (open < 0) {
          parasail_sw_stats_rowcol_striped_profile_sse41_128_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_stats_rowcol_striped_profile_sse41_128_64_cold_1();
        }
        else {
          uVar36 = uVar21 + 1;
          size = uVar36 >> 1;
          uVar8 = (ulong)(uVar37 - 1) % size;
          pvVar6 = (profile->profile64).matches;
          pvVar7 = (profile->profile64).similar;
          iVar19 = ppVar5->max;
          result = parasail_result_new_rowcol3((uint)uVar36 & 0x7ffffffe,s2Len);
          if (result != (parasail_result_t *)0x0) {
            result->flag = result->flag | 0x2850804;
            b = parasail_memalign___m128i(0x10,size);
            palVar22 = parasail_memalign___m128i(0x10,size);
            b_00 = parasail_memalign___m128i(0x10,size);
            palVar23 = parasail_memalign___m128i(0x10,size);
            b_01 = parasail_memalign___m128i(0x10,size);
            palVar24 = parasail_memalign___m128i(0x10,size);
            uStack_160 = local_168;
            local_168 = palVar24;
            b_02 = parasail_memalign___m128i(0x10,size);
            local_1a8 = parasail_memalign___m128i(0x10,size);
            b_03 = parasail_memalign___m128i(0x10,size);
            b_04 = parasail_memalign___m128i(0x10,size);
            b_05 = parasail_memalign___m128i(0x10,size);
            b_06 = parasail_memalign___m128i(0x10,size);
            local_1a0 = parasail_memalign___m128i(0x10,size);
            local_178 = parasail_memalign___m128i(0x10,size);
            local_138 = parasail_memalign___m128i(0x10,size);
            palVar25 = parasail_memalign___m128i(0x10,size);
            auVar43._0_8_ = -(ulong)(b == (__m128i *)0x0);
            auVar43._8_8_ = -(ulong)(palVar22 == (__m128i *)0x0);
            auVar102._0_8_ = -(ulong)(b_00 == (__m128i *)0x0);
            auVar102._8_8_ = -(ulong)(palVar23 == (__m128i *)0x0);
            auVar43 = packssdw(auVar43,auVar102);
            auVar70._0_8_ = -(ulong)(b_01 == (__m128i *)0x0);
            auVar70._8_8_ = -(ulong)(palVar24 == (__m128i *)0x0);
            auVar71._0_8_ = -(ulong)(b_02 == (__m128i *)0x0);
            auVar71._8_8_ = -(ulong)(local_1a8 == (__m128i *)0x0);
            auVar65 = packssdw(auVar70,auVar71);
            auVar43 = packssdw(auVar43,auVar65);
            auVar65._0_8_ = -(ulong)(b_03 == (__m128i *)0x0);
            auVar65._8_8_ = -(ulong)(b_04 == (__m128i *)0x0);
            auVar77._0_8_ = -(ulong)(b_05 == (__m128i *)0x0);
            auVar77._8_8_ = -(ulong)(b_06 == (__m128i *)0x0);
            auVar65 = packssdw(auVar65,auVar77);
            auVar103._0_8_ = -(ulong)(local_1a0 == (__m128i *)0x0);
            auVar103._8_8_ = -(ulong)(local_178 == (__m128i *)0x0);
            auVar82._0_8_ = -(ulong)(local_138 == (__m128i *)0x0);
            auVar82._8_8_ = -(ulong)(palVar25 == (__m128i *)0x0);
            auVar70 = packssdw(auVar103,auVar82);
            auVar65 = packssdw(auVar65,auVar70);
            auVar43 = packsswb(auVar43,auVar65);
            if ((((((((((((((((auVar43 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                             (auVar43 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar43 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar43 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar43 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar43 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar43 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar43 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar43 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar43 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar43 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar43 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar43 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar43 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar43 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar43[0xf]) {
              uVar41 = (ulong)(uint)gap;
              c[1] = (longlong)palVar23;
              c[0] = size;
              palVar24 = local_178;
              parasail_memset___m128i(b,c,(size_t)local_178);
              c_00[1] = extraout_RDX;
              c_00[0] = size;
              parasail_memset___m128i(b_00,c_00,(size_t)palVar24);
              c_01[1] = extraout_RDX_00;
              c_01[0] = size;
              parasail_memset___m128i(b_01,c_01,(size_t)palVar24);
              c_02[1] = extraout_RDX_01;
              c_02[0] = size;
              parasail_memset___m128i(b_02,c_02,(size_t)palVar24);
              c_03[1] = extraout_RDX_02;
              c_03[0] = size;
              parasail_memset___m128i(b_03,c_03,(size_t)palVar24);
              c_04[1] = extraout_RDX_03;
              c_04[0] = size;
              parasail_memset___m128i(b_04,c_04,(size_t)palVar24);
              c_05[1] = extraout_RDX_04;
              c_05[0] = size;
              parasail_memset___m128i(b_05,c_05,(size_t)palVar24);
              pmovsxbq(extraout_XMM0,0x101);
              c_06[1] = extraout_RDX_05;
              c_06[0] = size;
              parasail_memset___m128i(b_06,c_06,(size_t)palVar24);
              uVar9 = (uint)size;
              uVar17 = uVar9 - 1;
              uVar29 = 0;
              local_d8 = 0;
              local_c8 = -0x4000000000000000;
              auVar65 = (undefined1  [16])0x0;
              auVar59 = (undefined1  [16])0x0;
              auVar43 = ZEXT816(0);
              local_1c8 = 0;
              do {
                local_1b0 = b;
                palVar39 = b_02;
                palVar34 = b_00;
                palVar33 = b_01;
                palVar35 = local_168;
                lVar27 = local_1b0[uVar17][0];
                lVar100 = palVar34[uVar17][0];
                lVar93 = palVar33[uVar17][0];
                lVar91 = palVar39[uVar17][0];
                lVar58 = 0;
                lVar31 = (long)(int)uVar9 * (long)ppVar5->mapper[(byte)s2[uVar29]] * 0x10;
                pvVar32 = (void *)(lVar31 + (long)pvVar7);
                local_118 = (int)uVar29;
                bVar40 = (int)local_1c8 == local_118 + -2;
                palVar38 = local_178;
                palVar24 = palVar25;
                if (bVar40) {
                  palVar38 = palVar23;
                  palVar24 = local_1a8;
                }
                lVar28 = 0;
                b_02 = local_1a8;
                if (bVar40) {
                  b_02 = palVar25;
                }
                lVar64 = 0;
                b_01 = local_168;
                if (bVar40) {
                  b_01 = local_138;
                }
                lVar76 = 0;
                b = palVar22;
                b_00 = palVar23;
                if (bVar40) {
                  b = local_1a0;
                  b_00 = local_178;
                }
                auVar103 = ZEXT816(0);
                auVar73 = (undefined1  [16])0x0;
                lVar26 = 0;
                auVar79 = _DAT_009050f0;
                auVar70 = ZEXT816(0);
                do {
                  auVar81 = auVar70;
                  auVar70 = *(undefined1 (*) [16])((long)*b_03 + lVar26);
                  plVar1 = (long *)((long)pvVar4 + lVar26 + lVar31);
                  auVar83._0_8_ = lVar58 + *plVar1;
                  auVar83._8_8_ = lVar27 + plVar1[1];
                  auVar60._0_8_ = -(ulong)(0 < auVar83._0_8_);
                  auVar60._8_8_ = -(ulong)(0 < auVar83._8_8_);
                  auVar60 = auVar60 & auVar83;
                  auVar84._0_8_ = -(ulong)(auVar70._0_8_ < auVar60._0_8_);
                  auVar84._8_8_ = -(ulong)(auVar70._8_8_ < auVar60._8_8_);
                  auVar71 = blendvpd(auVar70,auVar60,auVar84);
                  auVar102 = *(undefined1 (*) [16])((long)*b_06 + lVar26);
                  auVar66._0_8_ = -(ulong)(auVar73._0_8_ < auVar71._0_8_);
                  auVar66._8_8_ = -(ulong)(auVar73._8_8_ < auVar71._8_8_);
                  auVar87 = blendvpd(auVar73,auVar71,auVar66);
                  auVar71 = *(undefined1 (*) [16])((long)*b_04 + lVar26);
                  auVar77 = *(undefined1 (*) [16])((long)*b_05 + lVar26);
                  *(undefined1 (*) [16])((long)*b + lVar26) = auVar87;
                  auVar82 = blendvpd(auVar81,auVar71,auVar66);
                  plVar1 = (long *)((long)pvVar6 + lVar26 + lVar31);
                  auVar97._0_8_ = lVar28 + *plVar1;
                  auVar97._8_8_ = lVar100 + plVar1[1];
                  lVar58 = auVar87._0_8_;
                  auVar61._0_8_ = -(ulong)(auVar60._0_8_ == lVar58);
                  lVar28 = auVar87._8_8_;
                  auVar61._8_8_ = -(ulong)(auVar60._8_8_ == lVar28);
                  auVar83 = blendvpd(auVar82,auVar97,auVar61);
                  auVar98._0_8_ = -(ulong)(lVar58 == 0);
                  auVar98._8_8_ = -(ulong)(lVar28 == 0);
                  auVar83 = ~auVar98 & auVar83;
                  auVar82 = blendvpd(auVar103,auVar77,auVar66);
                  *(undefined1 (*) [16])((long)*b_00 + lVar26) = auVar83;
                  auVar92._0_8_ = lVar64 + *(long *)((long)pvVar32 + lVar26);
                  auVar92._8_8_ = lVar93 + ((long *)((long)pvVar32 + lVar26))[1];
                  auVar84 = blendvpd(auVar82,auVar92,auVar61);
                  auVar84 = ~auVar98 & auVar84;
                  auVar82 = blendvpd(auVar79,auVar102,auVar66);
                  auVar85._8_4_ = 0xffffffff;
                  auVar85._0_8_ = 0xffffffffffffffff;
                  auVar85._12_4_ = 0xffffffff;
                  auVar89._0_8_ = lVar76 + 1;
                  auVar89._8_8_ = lVar91 - auVar85._8_8_;
                  auVar85 = blendvpd(auVar82,auVar89,auVar61);
                  auVar95._0_8_ = -(ulong)(auVar83._0_8_ < auVar65._0_8_);
                  auVar95._8_8_ = -(ulong)(auVar83._8_8_ < auVar65._8_8_);
                  auVar65 = blendvpd(auVar83,auVar65,auVar95);
                  auVar44._0_8_ = -(ulong)(auVar84._0_8_ < auVar65._0_8_);
                  auVar44._8_8_ = -(ulong)(auVar84._8_8_ < auVar65._8_8_);
                  auVar65 = blendvpd(auVar84,auVar65,auVar44);
                  auVar85 = ~auVar98 & auVar85;
                  auVar45._0_8_ = -(ulong)(auVar85._0_8_ < auVar65._0_8_);
                  auVar45._8_8_ = -(ulong)(auVar85._8_8_ < auVar65._8_8_);
                  auVar65 = blendvpd(auVar85,auVar65,auVar45);
                  auVar46._0_8_ = -(ulong)(auVar43._0_8_ < lVar58);
                  auVar46._8_8_ = -(ulong)(auVar43._8_8_ < lVar28);
                  auVar43 = blendvpd(auVar43,auVar87,auVar46);
                  uStack_e0 = (ulong)(uint)open;
                  auVar88._0_8_ = lVar58 - (ulong)(uint)open;
                  auVar88._8_8_ = lVar28 - uStack_e0;
                  uStack_a0 = (ulong)(uint)gap;
                  auVar94._0_8_ = auVar70._0_8_ - uVar41;
                  auVar94._8_8_ = auVar70._8_8_ - uStack_a0;
                  auVar87._0_8_ = -(ulong)(auVar94._0_8_ < auVar88._0_8_);
                  auVar87._8_8_ = -(ulong)(auVar94._8_8_ < auVar88._8_8_);
                  auVar95 = blendvpd(auVar94,auVar88,auVar87);
                  auVar82 = blendvpd(auVar71,auVar83,auVar87);
                  *(undefined1 (*) [16])((long)*b_01 + lVar26) = auVar84;
                  auVar71 = blendvpd(auVar77,auVar84,auVar87);
                  *(undefined1 (*) [16])((long)*b_02 + lVar26) = auVar85;
                  auVar90._8_4_ = 0xffffffff;
                  auVar90._0_8_ = 0xffffffffffffffff;
                  auVar90._12_4_ = 0xffffffff;
                  auVar101._0_8_ = auVar102._0_8_ + 1;
                  lVar58 = auVar90._8_8_;
                  auVar101._8_8_ = auVar102._8_8_ - lVar58;
                  auVar99._0_8_ = auVar85._0_8_ + 1;
                  auVar99._8_8_ = auVar85._8_8_ - lVar58;
                  auVar102 = blendvpd(auVar101,auVar99,auVar87);
                  auVar74._0_8_ = auVar73._0_8_ - uVar41;
                  auVar74._8_8_ = auVar73._8_8_ - uStack_a0;
                  auVar47._0_8_ = -(ulong)(auVar74._0_8_ < auVar88._0_8_);
                  auVar47._8_8_ = -(ulong)(auVar74._8_8_ < auVar88._8_8_);
                  auVar73 = blendvpd(auVar74,auVar88,auVar47);
                  auVar70 = blendvpd(auVar81,auVar83,auVar47);
                  *(undefined1 (*) [16])((long)*b_03 + lVar26) = auVar95;
                  *(undefined1 (*) [16])((long)*b_04 + lVar26) = auVar82;
                  *(undefined1 (*) [16])((long)*b_05 + lVar26) = auVar71;
                  *(undefined1 (*) [16])((long)*b_06 + lVar26) = auVar102;
                  auVar103 = blendvpd(auVar103,auVar84,auVar47);
                  auVar78._0_8_ = auVar79._0_8_ + 1;
                  auVar78._8_8_ = auVar79._8_8_ - lVar58;
                  auVar79 = blendvpd(auVar78,auVar99,auVar47);
                  plVar1 = (long *)((long)*local_1b0 + lVar26);
                  lVar58 = *plVar1;
                  lVar27 = plVar1[1];
                  plVar1 = (long *)((long)*palVar34 + lVar26);
                  lVar28 = *plVar1;
                  lVar100 = plVar1[1];
                  plVar1 = (long *)((long)*palVar33 + lVar26);
                  lVar64 = *plVar1;
                  lVar93 = plVar1[1];
                  plVar1 = (long *)((long)*palVar39 + lVar26);
                  lVar76 = *plVar1;
                  lVar91 = plVar1[1];
                  lVar26 = lVar26 + 0x10;
                } while (size << 4 != lVar26);
                uStack_160 = auVar81._8_8_;
                local_168 = palVar33;
                if ((int)local_1c8 == local_118 + -2) {
                  local_1a0 = palVar22;
                  local_138 = palVar35;
                }
                bVar40 = true;
                do {
                  bVar16 = bVar40;
                  lVar27 = local_1b0[uVar17][0];
                  lVar58 = 0;
                  auVar75._0_8_ = auVar73._0_8_;
                  auVar75._8_4_ = auVar73._0_4_;
                  auVar75._12_4_ = auVar73._4_4_;
                  auVar73._8_8_ = auVar75._8_8_;
                  auVar73._0_8_ = (long)-open;
                  auVar81._8_8_ = 0;
                  auVar81._0_8_ = auVar70._0_8_;
                  auVar70 = auVar81 << 0x40;
                  auVar10._8_8_ = 0;
                  auVar10._0_8_ = auVar103._0_8_;
                  auVar103 = auVar10 << 0x40;
                  auVar80._0_8_ = auVar79._0_8_;
                  auVar80._8_4_ = auVar79._0_4_;
                  auVar80._12_4_ = auVar79._4_4_;
                  auVar79._8_8_ = auVar80._8_8_;
                  auVar79._0_8_ = 1;
                  lVar28 = 0;
                  do {
                    plVar1 = (long *)((long)pvVar4 + lVar28 + lVar31);
                    uVar42 = lVar58 + *plVar1;
                    uVar56 = lVar27 + plVar1[1];
                    auVar102 = *(undefined1 (*) [16])((long)*b + lVar28);
                    auVar48._0_8_ = -(ulong)(auVar73._0_8_ < auVar102._0_8_);
                    lVar76 = auVar73._8_8_;
                    auVar48._8_8_ = -(ulong)(lVar76 < auVar102._8_8_);
                    auVar102 = blendvpd(auVar73,auVar102,auVar48);
                    *(undefined1 (*) [16])((long)*b + lVar28) = auVar102;
                    uVar57 = auVar102._0_8_;
                    auVar67._0_8_ = -(ulong)((-(ulong)(0 < (long)uVar42) & uVar42) == uVar57);
                    uVar42 = auVar102._8_8_;
                    auVar67._8_8_ = -(ulong)((-(ulong)(0 < (long)uVar56) & uVar56) == uVar42);
                    auVar67 = auVar67 | auVar48;
                    auVar71 = blendvpd(auVar70,*(undefined1 (*) [16])((long)*b_00 + lVar28),auVar67)
                    ;
                    *(undefined1 (*) [16])((long)*b_00 + lVar28) = auVar71;
                    auVar82 = blendvpd(auVar103,*(undefined1 (*) [16])((long)*b_01 + lVar28),auVar67
                                      );
                    *(undefined1 (*) [16])((long)*b_01 + lVar28) = auVar82;
                    auVar83 = blendvpd(auVar79,*(undefined1 (*) [16])((long)*b_02 + lVar28),auVar67)
                    ;
                    auVar49._0_8_ = -(ulong)(auVar71._0_8_ < auVar65._0_8_);
                    auVar49._8_8_ = -(ulong)(auVar71._8_8_ < auVar65._8_8_);
                    auVar65 = blendvpd(auVar71,auVar65,auVar49);
                    auVar50._0_8_ = -(ulong)(auVar82._0_8_ < auVar65._0_8_);
                    auVar50._8_8_ = -(ulong)(auVar82._8_8_ < auVar65._8_8_);
                    auVar65 = blendvpd(auVar82,auVar65,auVar50);
                    *(undefined1 (*) [16])((long)*b_02 + lVar28) = auVar83;
                    auVar51._0_8_ = -(ulong)(auVar83._0_8_ < auVar65._0_8_);
                    auVar51._8_8_ = -(ulong)(auVar83._8_8_ < auVar65._8_8_);
                    auVar65 = blendvpd(auVar83,auVar65,auVar51);
                    auVar52._0_8_ = -(ulong)(auVar43._0_8_ < (long)uVar57);
                    auVar52._8_8_ = -(ulong)(auVar43._8_8_ < (long)uVar42);
                    auVar43 = blendvpd(auVar43,auVar102,auVar52);
                    lVar58 = uVar57 - (uint)open;
                    lVar64 = uVar42 - uStack_e0;
                    auVar73._0_8_ = auVar73._0_8_ - uVar41;
                    auVar73._8_8_ = lVar76 - uStack_a0;
                    auVar53._0_8_ = -(ulong)(lVar58 < auVar73._0_8_);
                    auVar53._8_8_ = -(ulong)(lVar64 < auVar73._8_8_);
                    auVar68._0_8_ = -(ulong)(auVar73._0_8_ == lVar58);
                    auVar68._8_8_ = -(ulong)(auVar73._8_8_ == lVar64);
                    auVar86._0_8_ = -(ulong)(0 < auVar73._0_8_);
                    auVar86._8_8_ = -(ulong)(0 < auVar73._8_8_);
                    uVar30 = movmskpd((int)pvVar32,auVar86 & auVar68 | auVar53);
                    pvVar32 = (void *)(ulong)uVar30;
                    if (uVar30 == 0) goto LAB_00739e4f;
                    auVar62._0_8_ = -(ulong)(auVar73._0_8_ < lVar58);
                    auVar62._8_8_ = -(ulong)(auVar73._8_8_ < lVar64);
                    auVar70 = blendvpd(auVar70,auVar71,auVar62);
                    auVar103 = blendvpd(auVar103,auVar82,auVar62);
                    auVar102 = blendvpd(auVar79,auVar83,auVar62);
                    auVar79._0_8_ = auVar102._0_8_ + 1;
                    auVar79._8_8_ = auVar102._8_8_ + 1;
                    plVar1 = (long *)((long)*local_1b0 + lVar28);
                    lVar58 = *plVar1;
                    lVar27 = plVar1[1];
                    lVar28 = lVar28 + 0x10;
                  } while (size << 4 != lVar28);
                  bVar40 = false;
                } while (bVar16);
LAB_00739e4f:
                local_198 = local_1b0;
                uVar72 = (int)b[uVar8][1];
                uVar69 = (int)b_00[uVar8][1];
                uVar63 = (int)b_01[uVar8][1];
                uVar55 = (int)b_02[uVar8][1];
                if (uVar37 - 1 < uVar9) {
                  uVar72 = (int)b[uVar8][0];
                  uVar69 = (int)b_00[uVar8][0];
                  uVar63 = (int)b_01[uVar8][0];
                  uVar55 = (int)b_02[uVar8][0];
                }
                *(undefined4 *)(*((result->field_4).trace)->trace_del_table + uVar29 * 4) = uVar72;
                *(undefined4 *)
                 (*(long *)((long)((result->field_4).trace)->trace_del_table + 8) + uVar29 * 4) =
                     uVar69;
                *(undefined4 *)
                 (*(long *)((long)((result->field_4).trace)->trace_del_table + 0x10) + uVar29 * 4) =
                     uVar63;
                lVar58 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x18);
                *(undefined4 *)(lVar58 + uVar29 * 4) = uVar55;
                lVar31 = auVar43._0_8_;
                lVar28 = auVar43._8_8_;
                auVar54._0_8_ = -(ulong)(auVar59._0_8_ < lVar31);
                auVar54._8_8_ = -(ulong)(auVar59._8_8_ < lVar28);
                iVar18 = movmskpd((int)lVar58,auVar54);
                local_1a8 = palVar39;
                if (iVar18 != 0) {
                  local_c8 = lVar28;
                  if (lVar28 < lVar31) {
                    local_c8 = lVar31;
                  }
                  if ((long)(~(long)iVar19 + 0x7fffffffffffffffU) < local_c8) {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                    goto LAB_00739fa2;
                  }
                  auVar59._8_4_ = (int)local_c8;
                  auVar59._0_8_ = local_c8;
                  auVar59._12_4_ = (int)((ulong)local_c8 >> 0x20);
                  local_1c8 = uVar29 & 0xffffffff;
                }
                uVar29 = uVar29 + 1;
                palVar22 = local_1b0;
                palVar25 = palVar24;
                palVar23 = palVar34;
                local_178 = palVar38;
                local_118 = s2Len;
                if (uVar29 == (uint)s2Len) {
LAB_00739fa2:
                  lVar58 = size * 4;
                  lVar31 = 0;
                  do {
                    puVar2 = (undefined4 *)((long)*b + lVar31 * 4);
                    uVar72 = puVar2[2];
                    puVar3 = (undefined4 *)((long)*b_00 + lVar31 * 4);
                    uVar69 = *puVar3;
                    uVar63 = puVar3[2];
                    puVar3 = (undefined4 *)((long)*b_01 + lVar31 * 4);
                    uVar55 = *puVar3;
                    uVar11 = puVar3[2];
                    puVar3 = (undefined4 *)((long)*b_02 + lVar31 * 4);
                    uVar12 = *puVar3;
                    uVar13 = puVar3[2];
                    lVar28 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x20);
                    *(undefined4 *)(lVar28 + lVar31) = *puVar2;
                    *(undefined4 *)(lVar58 + lVar28 + lVar31) = uVar72;
                    lVar28 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x28);
                    *(undefined4 *)(lVar28 + lVar31) = uVar69;
                    *(undefined4 *)(lVar58 + lVar28 + lVar31) = uVar63;
                    lVar28 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x30);
                    *(undefined4 *)(lVar28 + lVar31) = uVar55;
                    *(undefined4 *)(lVar58 + lVar28 + lVar31) = uVar11;
                    lVar28 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x38);
                    *(undefined4 *)(lVar28 + lVar31) = uVar12;
                    *(undefined4 *)(lVar58 + lVar28 + lVar31) = uVar13;
                    lVar31 = lVar31 + 4;
                    size = size - 1;
                  } while (size != 0);
                  if ((local_c8 == 0x7fffffffffffffff) ||
                     (auVar96._0_8_ = -(ulong)(auVar65._0_8_ == 0x7fffffffffffffff),
                     auVar96._8_8_ = -(ulong)(auVar65._8_8_ == 0x7fffffffffffffff),
                     iVar19 = movmskpd(0xffffffff,auVar96), iVar19 != 0)) {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                  }
                  iVar19 = parasail_result_is_saturated(result);
                  iVar18 = 0;
                  palVar22 = palVar34;
                  if (iVar19 == 0) {
                    palVar23 = local_138;
                    palVar35 = palVar38;
                    ptr = b_02;
                    ptr_00 = b_00;
                    ptr_01 = b_01;
                    palVar25 = b;
                    ptr_02 = palVar24;
                    palVar15 = local_1a0;
                    if (((int)local_1c8 != local_118 + -1) &&
                       (palVar23 = b_01, palVar35 = b_00, ptr = palVar24, ptr_00 = palVar38,
                       ptr_01 = local_138, palVar25 = local_1a0, ptr_02 = b_02, palVar15 = b,
                       (int)local_1c8 == local_118 + -2)) {
                      palVar22 = palVar38;
                      local_168 = local_138;
                      ptr = palVar39;
                      ptr_00 = palVar34;
                      ptr_01 = palVar33;
                      palVar25 = local_1b0;
                      local_1a8 = palVar24;
                      local_198 = local_1a0;
                    }
                    local_1b0 = palVar15;
                    local_128._8_8_ = auVar77._8_8_;
                    if ((uVar36 & 0x7ffffffe) == 0) {
                      auVar14._8_8_ = 0;
                      auVar14._0_8_ = local_128._8_8_;
                      local_128 = auVar14 << 0x40;
                      iVar20 = 0;
                      iVar19 = 0;
                    }
                    else {
                      uVar36 = 0;
                      lVar27 = 0;
                      local_128._0_8_ = 0xc000000000000000;
                      do {
                        if ((*palVar25)[uVar36] == local_c8) {
                          uVar37 = 0;
                          if ((uVar36 & 1) != 0) {
                            uVar37 = uVar9;
                          }
                          uVar37 = uVar37 + ((uint)(uVar36 >> 1) & 0x7fffffff);
                          if ((int)uVar37 < (int)uVar21) {
                            local_d8 = (*ptr_00)[uVar36];
                            lVar27 = (*ptr_01)[uVar36];
                            local_128._0_8_ = (*ptr)[uVar36];
                            uVar21 = (ulong)uVar37;
                          }
                        }
                        iVar20 = (int)lVar27;
                        uVar37 = (uint)uVar21;
                        uVar36 = uVar36 + 1;
                      } while ((uVar9 & 0x3fffffff) * 2 != (int)uVar36);
                      iVar19 = (int)local_d8;
                    }
                    iVar18 = local_128._0_4_;
                  }
                  else {
                    iVar20 = 0;
                    iVar19 = 0;
                    local_c8 = 0;
                    local_1c8._0_4_ = 0;
                    uVar37 = 0;
                    palVar23 = b_01;
                    palVar35 = b_00;
                    ptr = palVar24;
                    ptr_00 = palVar38;
                    ptr_01 = local_138;
                    ptr_02 = b_02;
                    local_1b0 = b;
                    palVar25 = local_1a0;
                  }
                  result->score = (int)local_c8;
                  result->end_query = uVar37;
                  result->end_ref = (int)local_1c8;
                  ((result->field_4).stats)->matches = iVar19;
                  ((result->field_4).stats)->similar = iVar20;
                  ((result->field_4).stats)->length = iVar18;
                  parasail_free(ptr);
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(palVar25);
                  parasail_free(b_06);
                  parasail_free(b_05);
                  parasail_free(b_04);
                  parasail_free(b_03);
                  parasail_free(local_1a8);
                  parasail_free(ptr_02);
                  parasail_free(local_168);
                  parasail_free(palVar23);
                  parasail_free(palVar22);
                  parasail_free(palVar35);
                  parasail_free(local_198);
                  parasail_free(local_1b0);
                  return result;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

STATIC parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    __m128i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    __m128i vSaturationCheckMax;
    __m128i vPosLimit;
    int64_t maxp = 0;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile  = (__m128i*)profile->profile64.score;
    vProfileM = (__m128i*)profile->profile64.matches;
    vProfileS = (__m128i*)profile->profile64.similar;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi64x_rpl(1);
    score = NEG_INF;
    matches = NEG_INF;
    similar = NEG_INF;
    length = NEG_INF;
    vMaxH = vZero;
    vMaxHUnit = vZero;
    vSaturationCheckMax = vZero;
    vPosLimit = _mm_set1_epi64x_rpl(INT64_MAX);
    maxp = INT64_MAX - (int64_t)(matrix->max+1);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    pvHMax    = parasail_memalign___m128i(16, segLen);
    pvHMMax   = parasail_memalign___m128i(16, segLen);
    pvHSMax   = parasail_memalign___m128i(16, segLen);
    pvHLMax   = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;

    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi64x_rpl(-open), segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 8);
        vHM = _mm_slli_si128(vHM, 8);
        vHS = _mm_slli_si128(vHS, 8);
        vHL = _mm_slli_si128(vHL, 8);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            SWAP3(pvHMax,  pvHLoad,  pvHStore)
            SWAP3(pvHMMax, pvHMLoad, pvHMStore)
            SWAP3(pvHSMax, pvHSLoad, pvHSStore)
            SWAP3(pvHLMax, pvHLLoad, pvHLStore)
        }
        else {
            /* Swap the 2 H buffers. */
            SWAP(pvHLoad,  pvHStore)
            SWAP(pvHMLoad, pvHMStore)
            SWAP(pvHSLoad, pvHSStore)
            SWAP(pvHLLoad, pvHLStore)
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i cond_zero;
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vH_dag = _mm_max_epi64_rpl(vH_dag, vZero);
            vH = _mm_max_epi64_rpl(vH_dag, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            cond_zero = _mm_cmpeq_epi64(vH, vZero);

            case1 = _mm_cmpeq_epi64(vH, vH_dag);
            case2 = _mm_cmpeq_epi64(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi64(vHM, _mm_load_si128(vPM + i)), case1);
            vHM = _mm_andnot_si128(cond_zero, vHM);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi64(vHS, _mm_load_si128(vPS + i)), case1);
            vHS = _mm_andnot_si128(cond_zero, vHS);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi64(vHL, vOne), case1);
            vHL = _mm_andnot_si128(cond_zero, vHL);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
            vEF_opn = _mm_sub_epi64(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_add_epi64(vEL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi64(vFL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            vHp = _mm_slli_si128(vHp, 8);
            vF = _mm_slli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, -open, 0);
            vFM = _mm_slli_si128(vFM, 8);
            vFS = _mm_slli_si128(vFS, 8);
            vFL = _mm_slli_si128(vFL, 8);
            vFL = _mm_insert_epi64_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_add_epi64(vHp, _mm_load_si128(vP + i));
                vHp = _mm_max_epi64_rpl(vHp, vZero);
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi64(vH, vHp);
                case2 = _mm_cmpeq_epi64(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
                /* Update vF value. */
                vEF_opn = _mm_sub_epi64(vH, vGapO);
                vF_ext = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi64_rpl(vF_ext, vEF_opn),
                                _mm_and_si128(
                                    _mm_cmpeq_epi64(vF_ext, vEF_opn),
                                    _mm_cmpgt_epi64_rpl(vF_ext, vZero)))))
                    goto end;
                /*vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_add_epi64(vFL, vOne),
                        _mm_add_epi64(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
                vHM = _mm_slli_si128(vHM, 8);
                vHS = _mm_slli_si128(vHS, 8);
                vHL = _mm_slli_si128(vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
            result->stats->rowcols->length_row[j] = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi64_rpl(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi64_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi64x_rpl(score);
                end_ref = j;
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (score == INT64_MAX
            || _mm_movemask_epi8(_mm_cmpeq_epi64(vSaturationCheckMax,vPosLimit))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = 0;
        end_query = 0;
        end_ref = 0;
        matches = 0;
        similar = 0;
        length = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            SWAP(pvHMax,  pvHStore)
            SWAP(pvHMMax, pvHMStore)
            SWAP(pvHSMax, pvHSStore)
            SWAP(pvHLMax, pvHLStore)
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            SWAP(pvHMax,  pvHLoad)
            SWAP(pvHMMax, pvHMLoad)
            SWAP(pvHSMax, pvHSLoad)
            SWAP(pvHLMax, pvHLLoad)
        }
        /* Trace the alignment ending position on read. */
        {
            int64_t *t = (int64_t*)pvHMax;
            int64_t *m = (int64_t*)pvHMMax;
            int64_t *s = (int64_t*)pvHSMax;
            int64_t *l = (int64_t*)pvHLMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len;
            for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                        matches = *m;
                        similar = *s;
                        length = *l;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}